

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r)

{
  int iVar1;
  roaring_array_t *in_RDI;
  container_t *c;
  uint8_t type_original;
  int i;
  size_t answer;
  roaring_array_t *in_stack_ffffffffffffffd8;
  uint8_t local_15;
  int local_14;
  long local_10;
  roaring_array_t *local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  for (local_14 = 0; local_14 < local_8->size; local_14 = local_14 + 1) {
    ra_get_container_at_index(local_8,(uint16_t)local_14,&local_15);
    iVar1 = container_shrink_to_fit(in_stack_ffffffffffffffd8,'\0');
    local_10 = iVar1 + local_10;
  }
  iVar1 = ra_shrink_to_fit(in_stack_ffffffffffffffd8);
  return iVar1 + local_10;
}

Assistant:

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r) {
    size_t answer = 0;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original;
        container_t *c = ra_get_container_at_index(&r->high_low_container,
                                                   (uint16_t)i, &type_original);
        answer += container_shrink_to_fit(c, type_original);
    }
    answer += ra_shrink_to_fit(&r->high_low_container);
    return answer;
}